

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O2

UVector * icu_63::ZoneMeta::createMetazoneMappings(UnicodeString *tzid)

{
  UBool UVar1;
  int32_t iVar2;
  UResourceBundle *resB;
  UResourceBundle *fillIn;
  UChar *pUVar3;
  undefined8 *buffer;
  UVector *pUVar4;
  UErrorCode *size;
  undefined1 *text;
  char *target;
  undefined1 *text_00;
  UErrorCode status;
  UVector *local_110;
  UDate local_108;
  UDate local_100;
  UnicodeString canonicalID;
  char tzKey [129];
  
  status = U_ZERO_ERROR;
  canonicalID.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
  canonicalID.fUnion.fStackFields.fLengthAndFlags = 2;
  resB = ures_openDirect_63((char *)0x0,"metaZones",&status);
  ures_getByKey_63(resB,"metazoneInfo",resB,&status);
  getCanonicalCLDRID(tzid,&canonicalID,&status);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (-1 < canonicalID.fUnion.fStackFields.fLengthAndFlags) {
      canonicalID.fUnion.fFields.fLength = (int)canonicalID.fUnion.fStackFields.fLengthAndFlags >> 5
      ;
    }
    target = tzKey;
    iVar2 = UnicodeString::extract
                      (&canonicalID,0,canonicalID.fUnion.fFields.fLength,target,0x81,kInvariant);
    tzKey[iVar2] = '\0';
    do {
      if (*target == '/') {
        *target = ':';
      }
      else if (*target == '\0') goto LAB_0020d2b5;
      target = target + 1;
    } while( true );
  }
LAB_0020d46a:
  pUVar4 = (UVector *)0x0;
LAB_0020d46d:
  ures_close_63(resB);
  UnicodeString::~UnicodeString(&canonicalID);
  return pUVar4;
LAB_0020d2b5:
  ures_getByKey_63(resB,tzKey,resB,&status);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    fillIn = (UResourceBundle *)0x0;
    local_110 = (UVector *)0x0;
    do {
      while( true ) {
        UVar1 = ures_hasNext_63(resB);
        if (UVar1 == '\0') goto LAB_0020d442;
        fillIn = ures_getNextResource_63(resB,fillIn,&status);
        pUVar3 = ures_getStringByIndex_63(fillIn,0,(int32_t *)0x0,&status);
        iVar2 = ures_getSize_63(fillIn);
        text = gDefaultFrom;
        text_00 = gDefaultTo;
        if (iVar2 == 3) {
          text = (undefined1 *)ures_getStringByIndex_63(fillIn,1,(int32_t *)0x0,&status);
          text_00 = (undefined1 *)ures_getStringByIndex_63(fillIn,2,(int32_t *)0x0,&status);
        }
        if (status < U_ILLEGAL_ARGUMENT_ERROR) break;
LAB_0020d38a:
        status = U_ZERO_ERROR;
      }
      local_100 = parseDate((UChar *)text,&status);
      size = &status;
      local_108 = parseDate((UChar *)text_00,&status);
      if (U_ZERO_ERROR < status) goto LAB_0020d38a;
      buffer = (undefined8 *)uprv_malloc_63(0x18);
      if (buffer == (undefined8 *)0x0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        break;
      }
      *buffer = pUVar3;
      buffer[1] = local_100;
      buffer[2] = local_108;
      pUVar4 = local_110;
      if (local_110 == (UVector *)0x0) {
        pUVar4 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
        if (pUVar4 == (UVector *)0x0) {
          if (U_ZERO_ERROR < status) goto LAB_0020d431;
        }
        else {
          UVector::UVector(pUVar4,deleteOlsonToMetaMappingEntry,(UElementsAreEqual *)0x0,&status);
          if (U_ZERO_ERROR < status) {
            (*(pUVar4->super_UObject)._vptr_UObject[1])(pUVar4);
LAB_0020d431:
            uprv_free_63(buffer);
            local_110 = (UVector *)0x0;
            break;
          }
        }
      }
      local_110 = pUVar4;
      UVector::addElement(pUVar4,buffer,&status);
    } while (status < U_ILLEGAL_ARGUMENT_ERROR);
LAB_0020d442:
    ures_close_63(fillIn);
    pUVar4 = local_110;
    if (local_110 == (UVector *)0x0 || status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0020d46d;
    (*(local_110->super_UObject)._vptr_UObject[1])(local_110);
  }
  goto LAB_0020d46a;
}

Assistant:

UVector*
ZoneMeta::createMetazoneMappings(const UnicodeString &tzid) {
    UVector *mzMappings = NULL;
    UErrorCode status = U_ZERO_ERROR;

    UnicodeString canonicalID;
    UResourceBundle *rb = ures_openDirect(NULL, gMetaZones, &status);
    ures_getByKey(rb, gMetazoneInfo, rb, &status);
    getCanonicalCLDRID(tzid, canonicalID, status);

    if (U_SUCCESS(status)) {
        char tzKey[ZID_KEY_MAX + 1];
        int32_t tzKeyLen = canonicalID.extract(0, canonicalID.length(), tzKey, sizeof(tzKey), US_INV);
        tzKey[tzKeyLen] = 0;

        // tzid keys are using ':' as separators
        char *p = tzKey;
        while (*p) {
            if (*p == '/') {
                *p = ':';
            }
            p++;
        }

        ures_getByKey(rb, tzKey, rb, &status);

        if (U_SUCCESS(status)) {
            UResourceBundle *mz = NULL;
            while (ures_hasNext(rb)) {
                mz = ures_getNextResource(rb, mz, &status);

                const UChar *mz_name = ures_getStringByIndex(mz, 0, NULL, &status);
                const UChar *mz_from = gDefaultFrom;
                const UChar *mz_to = gDefaultTo;

                if (ures_getSize(mz) == 3) {
                    mz_from = ures_getStringByIndex(mz, 1, NULL, &status);
                    mz_to   = ures_getStringByIndex(mz, 2, NULL, &status);
                }

                if(U_FAILURE(status)){
                    status = U_ZERO_ERROR;
                    continue;
                }
                // We do not want to use SimpleDateformat to parse boundary dates,
                // because this code could be triggered by the initialization code
                // used by SimpleDateFormat.
                UDate from = parseDate(mz_from, status);
                UDate to = parseDate(mz_to, status);
                if (U_FAILURE(status)) {
                    status = U_ZERO_ERROR;
                    continue;
                }

                OlsonToMetaMappingEntry *entry = (OlsonToMetaMappingEntry*)uprv_malloc(sizeof(OlsonToMetaMappingEntry));
                if (entry == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                entry->mzid = mz_name;
                entry->from = from;
                entry->to = to;

                if (mzMappings == NULL) {
                    mzMappings = new UVector(deleteOlsonToMetaMappingEntry, NULL, status);
                    if (U_FAILURE(status)) {
                        delete mzMappings;
                        mzMappings = NULL;
                        uprv_free(entry);
                        break;
                    }
                }

                mzMappings->addElement(entry, status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
            ures_close(mz);
            if (U_FAILURE(status)) {
                if (mzMappings != NULL) {
                    delete mzMappings;
                    mzMappings = NULL;
                }
            }
        }
    }
    ures_close(rb);
    return mzMappings;
}